

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Mirror.cpp
# Opt level: O2

void __thiscall chrono::ChFunction_Mirror::ArchiveIN(ChFunction_Mirror *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_48;
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Mirror>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->fa;
  local_30._name = "fa";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->mirror_axis;
  local_48._name = "mirror_axis";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChFunction_Mirror::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Mirror>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(fa);
    marchive >> CHNVP(mirror_axis);
}